

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

logical pnga_update4_ghosts(Integer g_a)

{
  int *piVar1;
  int *piVar2;
  short sVar3;
  int *piVar4;
  Integer proc;
  logical lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  int *stride_arr;
  double *pdVar14;
  long lVar15;
  ulong uVar16;
  int msglen;
  char *local_150;
  char *local_148;
  long local_140;
  double local_138;
  int local_12c;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  int *local_108;
  int *local_100;
  Integer index [7];
  Integer width [7];
  char rcv_name [32];
  char send_name [32];
  
  proc = pnga_nodeid();
  lVar5 = pnga_has_ghosts(g_a);
  if (lVar5 != 0) {
    lVar15 = g_a + 1000;
    sVar3 = GA[lVar15].ndim;
    lVar10 = (long)sVar3;
    pdVar14 = GA[lVar15].cache;
    iVar9 = GA[lVar15].elemsize;
    lVar6 = 0;
    local_120 = 0;
    if (0 < lVar10) {
      local_120 = lVar10;
    }
    local_128 = g_a * 0x368;
    for (; local_120 != lVar6; lVar6 = lVar6 + 1) {
      width[lVar6] = GA[g_a + 1000].width[lVar6];
    }
    pnga_proc_topology(g_a,proc,index);
    local_138 = *pdVar14;
    pdVar14 = pdVar14 + 1;
    lVar6 = (long)local_138 / (long)iVar9;
    builtin_strncpy(send_name,"send_buffer",0xc);
    builtin_strncpy(rcv_name,"receive_buffer",0xf);
    local_148 = (char *)pnga_malloc(lVar6,GA[lVar15].type,send_name);
    local_150 = (char *)pnga_malloc(lVar6,GA[lVar15].type,rcv_name);
    local_12c = sVar3 + -1;
    lVar8 = local_120 << 3;
    lVar6 = local_128 + 0xd4ee0;
    local_140 = 0;
    local_120 = lVar8;
    local_118 = lVar10;
    for (lVar15 = 0; pcVar13 = local_148, lVar8 != lVar15; lVar15 = lVar15 + 8) {
      lVar11 = lVar10;
      if (*(long *)((long)width + lVar15) != 0) {
        stride_arr = (int *)(lVar10 * 4 + 0x20 + (long)pdVar14);
        piVar1 = stride_arr + lVar10;
        local_100 = stride_arr + lVar10 + 2;
        local_128 = lVar6;
        armci_write_strided((void *)*pdVar14,local_12c,(int *)(pdVar14 + 4),local_100,local_148);
        if ((double)GAme != pdVar14[2]) {
          uVar16 = (ulong)*(int *)((long)GA->dims + local_128 + -0x30);
          iVar9 = SUB84(pdVar14[2],0);
          iVar12 = (int)local_140;
          if ((uVar16 & 1) == 0) {
            if ((*(byte *)((long)index + lVar15) & 1) == 0) {
              armci_msg_rcv(iVar12,local_150,SUB84(local_138,0),&msglen,*(int *)(pdVar14 + 3));
            }
            else {
              armci_msg_snd(iVar12,local_148,*piVar1,iVar9);
            }
            if ((*(byte *)((long)index + lVar15) & 1) == 0) {
              armci_msg_snd((int)local_140,local_148,*piVar1,*(int *)(pdVar14 + 2));
              pcVar13 = local_150;
              goto LAB_00178064;
            }
          }
          else {
            uVar16 = uVar16 - 1;
            if ((*(ulong *)((long)index + lVar15) & 1) == 0) {
              uVar7 = uVar16;
              if (*(ulong *)((long)index + lVar15) != uVar16) {
                armci_msg_rcv(iVar12,local_150,SUB84(local_138,0),&msglen,*(int *)(pdVar14 + 3));
                goto LAB_00177fd1;
              }
            }
            else {
              armci_msg_snd(iVar12,local_148,*piVar1,iVar9);
LAB_00177fd1:
              uVar7 = *(ulong *)((long)index + lVar15);
            }
            if ((uVar7 & 1) == 0) {
              if (uVar7 != 0) {
                armci_msg_snd((int)local_140,local_148,*piVar1,*(int *)(pdVar14 + 2));
              }
            }
            else {
              armci_msg_rcv((int)local_140,local_150,SUB84(local_138,0),&msglen,
                            *(int *)(pdVar14 + 3));
            }
            uVar7 = *(ulong *)((long)index + lVar15);
            if (uVar7 == 0) {
              armci_msg_snd((int)local_140,local_148,*piVar1,*(int *)(pdVar14 + 2));
              uVar7 = *(ulong *)((long)index + lVar15);
            }
            pcVar13 = local_150;
            if (uVar7 != uVar16) goto LAB_00178064;
          }
          pcVar13 = local_150;
          armci_msg_rcv((int)local_140,local_150,SUB84(local_138,0),&msglen,*(int *)(pdVar14 + 3));
        }
LAB_00178064:
        piVar4 = local_100;
        iVar9 = local_12c;
        armci_read_strided((void *)pdVar14[1],local_12c,stride_arr,local_100,pcVar13);
        pcVar13 = local_148;
        local_108 = piVar1 + lVar10 * 2 + 10;
        piVar2 = local_108 + lVar10;
        local_110 = lVar15;
        armci_write_strided(*(void **)(piVar4 + lVar10),iVar9,piVar1 + lVar10 + 10,
                            piVar1 + lVar10 * 3 + 0xc,local_148);
        lVar15 = local_110;
        if (GAme != *(long *)(stride_arr + lVar10 * 2 + 8)) {
          iVar9 = (int)local_140 + 1;
          uVar16 = (ulong)*(int *)((long)GA->dims + local_128 + -0x30);
          iVar12 = (int)*(long *)(stride_arr + lVar10 * 2 + 8);
          if ((uVar16 & 1) == 0) {
            if ((*(byte *)((long)index + local_110) & 1) == 0) {
              armci_msg_rcv(iVar9,local_150,SUB84(local_138,0),&msglen,iVar12);
            }
            else {
              armci_msg_snd(iVar9,local_148,*piVar2,piVar1[lVar10 + 6]);
            }
            if ((*(byte *)((long)index + lVar15) & 1) == 0) {
              armci_msg_snd(iVar9,local_148,*piVar2,piVar1[lVar10 + 6]);
              pcVar13 = local_150;
            }
            else {
LAB_00178204:
              pcVar13 = local_150;
              armci_msg_rcv(iVar9,local_150,SUB84(local_138,0),&msglen,piVar1[lVar10 + 8]);
            }
          }
          else {
            if ((*(ulong *)((long)index + local_110) & 1) == 0) {
              if (*(ulong *)((long)index + local_110) != 0) {
                armci_msg_rcv(iVar9,local_150,SUB84(local_138,0),&msglen,iVar12);
              }
            }
            else {
              armci_msg_snd(iVar9,local_148,*piVar2,piVar1[lVar10 + 6]);
            }
            uVar16 = uVar16 - 1;
            if ((*(ulong *)((long)index + lVar15) & 1) == 0) {
              if (*(ulong *)((long)index + lVar15) != uVar16) {
                armci_msg_snd(iVar9,local_148,*piVar2,piVar1[lVar10 + 6]);
              }
            }
            else {
              armci_msg_rcv(iVar9,local_150,SUB84(local_138,0),&msglen,piVar1[lVar10 + 8]);
            }
            uVar7 = *(ulong *)((long)index + lVar15);
            if (uVar7 == uVar16) {
              armci_msg_snd(iVar9,local_148,*piVar2,piVar1[lVar10 + 6]);
              uVar7 = *(ulong *)((long)index + lVar15);
            }
            pcVar13 = local_150;
            if (uVar7 == 0) goto LAB_00178204;
          }
        }
        lVar11 = local_118;
        pdVar14 = (double *)(piVar2 + local_118 + 2);
        armci_read_strided(*(void **)(piVar1 + lVar10 + 4),local_12c,local_108,
                           piVar1 + lVar10 * 3 + 0xc,pcVar13);
        local_140 = local_140 + 2;
        lVar6 = local_128;
        lVar8 = local_120;
      }
      lVar6 = lVar6 + 4;
      lVar10 = lVar11;
    }
    pnga_free(local_150);
    pnga_free(local_148);
  }
  return 1;
}

Assistant:

logical pnga_update4_ghosts(Integer g_a)
{
  Integer idx, i, handle=GA_OFFSET + g_a;
  Integer *size, bufsize, buflen, ndim, elemsize;
  Integer *proc_rem_snd, *proc_rem_rcv, pmax;
  Integer msgcnt, *length;
  Integer index[MAXDIM], width[MAXDIM];
  int *stride_snd, *stride_rcv, *count, msglen;
  char **ptr_snd, **ptr_rcv, *cache, *current;
  char send_name[32], rcv_name[32];
  void *snd_ptr, *rcv_ptr, *snd_ptr_orig, *rcv_ptr_orig;
  Integer me = pnga_nodeid();
  /*Integer p_handle;*/

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This implementation make use of explicit message passing to perform
   * the update. Separate message types for the updates in each coordinate
   * direction are used to maintain synchronization locally and to
   * guarantee that the data is present before the updates in a new
   * coordinate direction take place.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  ndim = GA[handle].ndim;
  /*p_handle = GA[handle].p_handle;*/
  cache = (char *)GA[handle].cache;
  elemsize = GA[handle].elemsize;
  for (i=0; i<ndim; i++) {
    width[i] = (Integer)GA[handle].width[i];
  }

  msgcnt = 0;

  /* Get indices of processor in virtual grid */
  pnga_proc_topology(g_a, me, index);

  size = (Integer*)cache;
  current = (char*)(size+1);
  bufsize = *size;
  buflen = bufsize/elemsize;
#if GHOST_PRINT
  printf("p[%d] bufsize: %d buflen: %d\n", GAme, bufsize, buflen);
  fflush(stdout);
#endif

  strcpy(send_name,"send_buffer");
  strcpy(rcv_name,"receive_buffer");
  snd_ptr_orig = snd_ptr = pnga_malloc(buflen, GA[handle].type, send_name);
  rcv_ptr_orig = rcv_ptr = pnga_malloc(buflen, GA[handle].type, rcv_name);

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {

    /* Do not bother with update if nwidth is zero */
    if (width[idx] != 0) {

      /* send messages in negative direction */
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

#if GHOST_PRINT
      printf("p[%d] 1: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)*ptr_snd,
              (Integer)*ptr_rcv);
      printf("p[%d] 1: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)*length, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d] 1: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d] 1: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d] 1: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d] 1: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d] 1: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      /* Fill send buffer with data. */
      armci_write_strided(*ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);
#if GHOST_PRINT
      printf("p[%d] completed armci_write_strided\n",GAme);
      fflush(stdout);
#endif

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

      if (GAme != *proc_rem_snd) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else if (index[idx] != pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else if (index[idx] != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          if (index[idx] == pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      msgcnt++;
      /* copy data back into global array */
      armci_read_strided(*ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);
#if GHOST_PRINT
      printf("p[%d] completed armci_read_strided\n",GAme);
      fflush(stdout);
#endif

      /* send messages in positive direction */
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

#if GHOST_PRINT
      printf("p[%d] 2: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)*ptr_snd,
              (Integer)*ptr_rcv);
      printf("p[%d] 2: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)*length, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d] 2: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d] 2: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d] 2: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d] 2: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d] 2: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      /* Fill send buffer with data. */
      armci_write_strided(*ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

      if (GAme != *proc_rem_rcv) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else if (index[idx] != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else if (index[idx] != pmax) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == pmax) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          if (index[idx] == 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      /* copy data back into global array */
      armci_read_strided(*ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);
      msgcnt++;
    }
  }

  pnga_free(rcv_ptr_orig);
  pnga_free(snd_ptr_orig);
  return TRUE;
}